

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O2

void __thiscall
btSpatialTransformationMatrix::transform<btSpatialMotionVector>
          (btSpatialTransformationMatrix *this,btSpatialMotionVector *inVec,
          btSpatialMotionVector *outVec,eOutputOperation outOp)

{
  undefined1 auVar1 [16];
  btVector3 bVar2;
  btVector3 bVar3;
  float local_58;
  float fStack_54;
  float local_48;
  btVector3 local_30;
  
  if (outOp == Subtract) {
    local_30 = operator*(&this->m_rotMat,&inVec->m_topVec);
    btVector3::operator-=(&outVec->m_topVec,&local_30);
    bVar2 = btVector3::cross(&this->m_trnVec,&outVec->m_topVec);
    bVar3 = operator*(&this->m_rotMat,&inVec->m_bottomVec);
    local_58 = bVar2.m_floats[0];
    fStack_54 = bVar2.m_floats[1];
    local_48 = bVar2.m_floats[2];
    local_30.m_floats[1] = bVar3.m_floats[1] - fStack_54;
    local_30.m_floats[0] = bVar3.m_floats[0] - local_58;
    local_30.m_floats[2] = bVar3.m_floats[2] - local_48;
    local_30.m_floats[3] = 0.0;
    btVector3::operator-=(&outVec->m_bottomVec,&local_30);
  }
  else if (outOp == Add) {
    local_30 = operator*(&this->m_rotMat,&inVec->m_topVec);
    btVector3::operator+=(&outVec->m_topVec,&local_30);
    bVar2 = btVector3::cross(&this->m_trnVec,&outVec->m_topVec);
    bVar3 = operator*(&this->m_rotMat,&inVec->m_bottomVec);
    local_58 = bVar2.m_floats[0];
    fStack_54 = bVar2.m_floats[1];
    local_48 = bVar2.m_floats[2];
    local_30.m_floats[1] = bVar3.m_floats[1] - fStack_54;
    local_30.m_floats[0] = bVar3.m_floats[0] - local_58;
    local_30.m_floats[2] = bVar3.m_floats[2] - local_48;
    local_30.m_floats[3] = 0.0;
    btVector3::operator+=(&outVec->m_bottomVec,&local_30);
  }
  else if (outOp == None) {
    bVar2 = operator*(&this->m_rotMat,&inVec->m_topVec);
    *&(outVec->m_topVec).m_floats = bVar2.m_floats;
    bVar2 = btVector3::cross(&this->m_trnVec,&outVec->m_topVec);
    bVar3 = operator*(&this->m_rotMat,&inVec->m_bottomVec);
    local_58 = bVar2.m_floats[0];
    fStack_54 = bVar2.m_floats[1];
    local_48 = bVar2.m_floats[2];
    auVar1._4_4_ = bVar3.m_floats[1] - fStack_54;
    auVar1._0_4_ = bVar3.m_floats[0] - local_58;
    auVar1._8_4_ = bVar3.m_floats[2] - local_48;
    auVar1._12_4_ = 0;
    *(undefined1 (*) [16])(outVec->m_bottomVec).m_floats = auVar1;
  }
  return;
}

Assistant:

void transform(	const SpatialVectorType &inVec,
                      SpatialVectorType &outVec,
					eOutputOperation outOp = None)
	{
		if(outOp == None)
		{
			outVec.m_topVec = m_rotMat * inVec.m_topVec;
			outVec.m_bottomVec = -m_trnVec.cross(outVec.m_topVec) + m_rotMat * inVec.m_bottomVec;
		}
		else if(outOp == Add)
		{
			outVec.m_topVec += m_rotMat * inVec.m_topVec;
			outVec.m_bottomVec += -m_trnVec.cross(outVec.m_topVec) + m_rotMat * inVec.m_bottomVec;
		}
		else if(outOp == Subtract)
		{
			outVec.m_topVec -= m_rotMat * inVec.m_topVec;
			outVec.m_bottomVec -= -m_trnVec.cross(outVec.m_topVec) + m_rotMat * inVec.m_bottomVec;
		}
		
	}